

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O0

void verify_staleblock_reuse_param_test(void)

{
  fdb_status fVar1;
  sb_decision_t sVar2;
  char *pcVar3;
  fdb_status s_4;
  fdb_status s_3;
  fdb_status s_2;
  fdb_status s_1;
  fdb_status s;
  fdb_config fconfig;
  fdb_file_info file_info;
  sb_decision_t sb_decision;
  fdb_kvs_config kvs_config;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_status status;
  char bodybuf [512];
  char keybuf [512];
  int kv;
  int r;
  uint64_t i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *in_stack_fffffffffffff9b8;
  fdb_file_handle *in_stack_fffffffffffff9c0;
  FILE *pFVar4;
  undefined4 in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9dc;
  void *in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9ec;
  fdb_file_info *in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffff9fc;
  long local_528;
  long local_510;
  ulong local_4c0;
  char local_468 [64];
  fdb_config *in_stack_fffffffffffffbd8;
  char *in_stack_fffffffffffffbe0;
  fdb_file_handle **in_stack_fffffffffffffbe8;
  char local_268 [520];
  undefined4 local_60;
  int local_5c;
  ulong local_58;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  local_60 = 0x200;
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  local_528 = 0x41;
  while( true ) {
    local_5c = system("rm -rf  staleblktest* > errorlog.txt");
    fdb_open(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    fdb_kvs_open_default
              (in_stack_fffffffffffff9c0,&in_stack_fffffffffffff9b8->root,(fdb_kvs_config *)0x104c7c
              );
    for (local_58 = 0; local_58 < local_510 + 1U; local_58 = local_58 + 1) {
      sprintf(local_268,"key");
      fVar1 = fdb_set_kv((fdb_kvs_handle *)
                         CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                         in_stack_fffffffffffff9f0,
                         CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                         in_stack_fffffffffffff9e0,
                         CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
      pFVar4 = _stderr;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcVar3 = fdb_error_msg(fVar1);
        fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x95);
        verify_staleblock_reuse_param_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x95,"void verify_staleblock_reuse_param_test()");
      }
      fVar1 = fdb_commit(in_stack_fffffffffffff9b8,'\0');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pFVar4 = _stderr;
        pcVar3 = fdb_error_msg(fVar1);
        fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x97);
        verify_staleblock_reuse_param_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x97,"void verify_staleblock_reuse_param_test()");
      }
    }
    local_58 = 0;
    do {
      sprintf(local_268,"key");
      sprintf(local_468,"body%d",local_58 & 0xffffffff);
      fVar1 = fdb_set_kv((fdb_kvs_handle *)
                         CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                         in_stack_fffffffffffff9f0,
                         CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                         in_stack_fffffffffffff9e0,
                         CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pFVar4 = _stderr;
        pcVar3 = fdb_error_msg(fVar1);
        fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0xa0);
        verify_staleblock_reuse_param_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0xa0,"void verify_staleblock_reuse_param_test()");
      }
      local_58 = local_58 + 1;
      fVar1 = fdb_get_file_info((fdb_file_handle *)
                                CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                                in_stack_fffffffffffff9f0);
      pFVar4 = _stderr;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcVar3 = fdb_error_msg(fVar1);
        fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0xa3);
        verify_staleblock_reuse_param_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0xa3,"void verify_staleblock_reuse_param_test()");
      }
    } while (local_4c0 < 0x1000000);
    sVar2 = sb_check_block_reusing
                      ((fdb_kvs_handle *)
                       CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    if (local_528 == 0x41) {
      if (sVar2 != SBD_RECLAIM) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0xa9);
        verify_staleblock_reuse_param_test::__test_pass = 0;
        if (sVar2 != SBD_RECLAIM) {
          __assert_fail("sb_decision == SBD_RECLAIM",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                        ,0xa9,"void verify_staleblock_reuse_param_test()");
        }
      }
    }
    else if (sVar2 != SBD_NONE) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0xab);
      verify_staleblock_reuse_param_test::__test_pass = 0;
      if (sVar2 != SBD_NONE) {
        __assert_fail("sb_decision == SBD_NONE",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0xab,"void verify_staleblock_reuse_param_test()");
      }
    }
    fVar1 = fdb_close(in_stack_fffffffffffff9b8);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    fdb_shutdown();
    if (local_528 == 0x41) {
      local_528 = 0;
    }
    else {
      if (local_528 != 0) {
        memleak_end();
        if (verify_staleblock_reuse_param_test::__test_pass == 0) {
          fprintf(_stderr,"%s FAILED\n","verify staleblock reuse param test");
        }
        else {
          fprintf(_stderr,"%s PASSED\n","verify staleblock reuse param test");
        }
        return;
      }
      local_528 = 100;
    }
  }
  pFVar4 = _stderr;
  pcVar3 = fdb_error_msg(fVar1);
  fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,0xb0);
  verify_staleblock_reuse_param_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0xb0,"void verify_staleblock_reuse_param_test()");
}

Assistant:

void verify_staleblock_reuse_param_test() {
    TEST_INIT();
    memleak_start();

    uint64_t i;
    int r;
    const int kv = 512;
    char keybuf[kv];
    char bodybuf[kv];
    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    sb_decision_t sb_decision;
    fdb_file_info file_info;

    // set block reuse threshold = 65
    fdb_config fconfig = fdb_get_default_config();
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 65;

start_data_loading:
    // remove previous staleblktest files
    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./staleblktest1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // create num_keeping_headers+1
    for (i = 0; i < fconfig.num_keeping_headers + 1; i++) {
        sprintf(keybuf, "key");
        status = fdb_set_kv(db, keybuf, kv, NULL, 0);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        sprintf(keybuf, "key");
        sprintf(bodybuf, "body%d", static_cast<int>(i));
        status = fdb_set_kv(db, keybuf, kv, bodybuf, kv);
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size < SB_MIN_BLOCK_REUSING_FILESIZE);

    // expect block reclaim only for valid threshold value
    sb_decision = sb_check_block_reusing(db);
    if (fconfig.block_reusing_threshold == 65) {
        TEST_CHK(sb_decision == SBD_RECLAIM);
    } else {
        TEST_CHK(sb_decision == SBD_NONE);
    }

    // intermediate cleanup
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    // run again with different config
    if (fconfig.block_reusing_threshold == 65) {
        // disable with 0
        fconfig.block_reusing_threshold = 0;
        goto start_data_loading;
    } else if (fconfig.block_reusing_threshold == 0) {
        // disable with 100
        fconfig.block_reusing_threshold = 100;
        goto start_data_loading;
    }

    memleak_end();
    TEST_RESULT("verify staleblock reuse param test");
}